

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hash.cpp
# Opt level: O0

void __thiscall HashTbl::Grow(HashTbl *this)

{
  code *pcVar1;
  bool bVar2;
  HRESULT HVar3;
  uint mask;
  uint uVar4;
  uint uVar5;
  undefined4 *puVar6;
  IdentPtr *buckets;
  Ident *local_70;
  Ident *local_68;
  uint local_58;
  uint local_54;
  uint i_1;
  int emptyBuckets;
  uint32 luIndex;
  uint32 luHash;
  IdentPtr next;
  IdentPtr pid;
  uint i;
  IdentPtr *n_prgpidName;
  uint n_luMask;
  int32 cb;
  uint cbTemp;
  uint n_cidHash;
  uint cidHash;
  HashTbl *this_local;
  
  cbTemp = this->m_luMask + 1;
  cb = cbTemp * 4;
  _n_cidHash = this;
  if ((cb == 0) || ((cb & cb - 1U) != 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Hash.cpp"
                       ,0x42,"(n_cidHash > 0 && 0 == (n_cidHash & (n_cidHash - 1)))",
                       "n_cidHash > 0 && 0 == (n_cidHash & (n_cidHash - 1))");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  HVar3 = UIntMult(cb,8,&n_luMask);
  if ((-1 < HVar3) && (n_luMask < 0x80000000)) {
    mask = cb - 1;
    buckets = (IdentPtr *)NoReleaseAllocator::Alloc(&this->m_noReleaseAllocator,n_luMask);
    if (buckets != (IdentPtr *)0x0) {
      memset(buckets,0,(long)(int)n_luMask);
      for (pid._4_4_ = 0; pid._4_4_ < cbTemp; pid._4_4_ = pid._4_4_ + 1) {
        next = this->m_prgpidName[pid._4_4_];
        if (next == (Ident *)0x0) {
          local_68 = (Ident *)0x0;
        }
        else {
          local_68 = next->m_pidNext;
        }
        _luIndex = local_68;
        while (next != (IdentPtr)0x0) {
          uVar4 = next->m_luHash & mask;
          next->m_pidNext = buckets[uVar4];
          buckets[uVar4] = next;
          next = _luIndex;
          if (_luIndex == (Ident *)0x0) {
            local_70 = (Ident *)0x0;
          }
          else {
            local_70 = _luIndex->m_pidNext;
          }
          _luIndex = local_70;
        }
      }
      uVar5 = CountAndVerifyItems(this,buckets,cb,mask);
      if (uVar5 != this->m_luCount) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Hash.cpp"
                           ,0x60,
                           "(CountAndVerifyItems(n_prgpidName, n_cidHash, n_luMask) == m_luCount)",
                           "CountAndVerifyItems(n_prgpidName, n_cidHash, n_luMask) == m_luCount");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      this->m_prgpidName = buckets;
      this->m_luMask = mask;
      if (this->stats != (DictionaryStats *)0x0) {
        local_54 = 0;
        for (local_58 = 0; local_58 < (uint)cb; local_58 = local_58 + 1) {
          if (this->m_prgpidName[local_58] == (Ident *)0x0) {
            local_54 = local_54 + 1;
          }
        }
        DictionaryStats::Resize(this->stats,cb,local_54);
      }
    }
  }
  return;
}

Assistant:

void HashTbl::Grow()
{
    // Grow the bucket size by grow factor
    // Has the side-effect of inverting the order the pids appear in their respective buckets.
    uint cidHash = m_luMask + 1;
    uint n_cidHash = cidHash * GrowFactor;
    Assert(n_cidHash > 0 && 0 == (n_cidHash & (n_cidHash - 1)));

    // Win8 730594 - Use intsafe function to check for overflow.
    uint cbTemp;
    if (FAILED(UIntMult(n_cidHash, sizeof(Ident *), &cbTemp)) || cbTemp > LONG_MAX)
        // It is fine to exit early here, we will just have a potentially densely populated hash table
        return;
    int32 cb = cbTemp;
    uint n_luMask = n_cidHash - 1;

    IdentPtr *n_prgpidName = (IdentPtr *)m_noReleaseAllocator.Alloc(cb);
    if (n_prgpidName == nullptr)
        // It is fine to exit early here, we will just have a potentially densely populated hash table
        return;

    // Clear the array
    memset(n_prgpidName, 0, cb);

    // Place each entry its new bucket.
    for (uint i = 0; i < cidHash; i++)
    {
        for (IdentPtr pid = m_prgpidName[i], next = pid ? pid->m_pidNext : nullptr; pid; pid = next, next = pid ? pid->m_pidNext : nullptr)
        {
            uint32 luHash = pid->m_luHash;
            uint32 luIndex = luHash & n_luMask;
            pid->m_pidNext = n_prgpidName[luIndex];
            n_prgpidName[luIndex] = pid;
        }
    }

    Assert(CountAndVerifyItems(n_prgpidName, n_cidHash, n_luMask) == m_luCount);

    // Update the table fields.
    m_prgpidName = n_prgpidName;
    m_luMask= n_luMask;

#if PROFILE_DICTIONARY
    if(stats)
    {
        int emptyBuckets = 0;
        for (uint i = 0; i < n_cidHash; i++)
        {
            if(m_prgpidName[i] == nullptr)
            {
                emptyBuckets++;
            }
        }
        stats->Resize(n_cidHash, emptyBuckets);
    }
#endif
}